

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_executed_with_price *m)

{
  uint uVar1;
  iterator iVar2;
  undefined8 uVar3;
  order_book *this_00;
  ulong quantity;
  ulong uVar4;
  ulong uVar5;
  execution result;
  trade t;
  event local_a8;
  execution local_68;
  trade local_50;
  
  local_a8._0_8_ = ZEXT28(m->StockLocate);
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,(key_type *)&local_a8);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur != (__node_type *)0x0) {
    uVar1 = m->ExecutedShares;
    quantity = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
    uVar1 = m->ExecutionPrice;
    uVar4 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar5 = (ulong)*(uint6 *)&m->field_0x5;
    uVar4 = ((uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
             (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
            uVar5 << 0x38) >> 0x10;
    this_00 = (order_book *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x10);
    order_book::execute(&local_68,this_00,m->OrderReferenceNumber,quantity);
    *(ulong *)((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                     ._M_cur + 0x30) = uVar4;
    local_50.sign = itch50_trade_sign(local_68.side);
    local_50.timestamp = uVar4;
    local_50.price =
         (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    local_50.size = quantity;
    make_event(&local_a8,(string *)this_00,uVar4,this_00,&local_50,
               (uint)(local_68.remaining == 0) << 2);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar3 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._symbol._M_dataplus._M_p != &local_a8._symbol.field_2) {
        operator_delete(local_a8._symbol._M_dataplus._M_p,
                        local_a8._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar3);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._symbol._M_dataplus._M_p != &local_a8._symbol.field_2) {
      operator_delete(local_a8._symbol._M_dataplus._M_p,
                      local_a8._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_executed_with_price* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t quantity = be32toh(m->ExecutedShares);
        uint64_t price = be32toh(m->ExecutionPrice);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        auto& ob = it->second;
        auto result = ob.execute(m->OrderReferenceNumber, quantity);
        ob.set_timestamp(timestamp);
        trade t{timestamp, price, quantity, itch50_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp, &ob, &t, sweep_event(result)));
    }
}